

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::to_wave_action(Application *this)

{
  Application *this_local;
  
  DynamicScene::XFormWidget::exitObjectMode(this->scene->elementTransform);
  DynamicScene::XFormWidget::enterTransformedMode(this->scene->elementTransform);
  DynamicScene::XFormWidget::setTranslate(this->scene->elementTransform);
  DynamicScene::Scene::removeObject(this->scene,&this->scene->elementTransform->super_SceneObject);
  this->action = Wave;
  setGhosted(this,false);
  return;
}

Assistant:

void Application::to_wave_action()
{
  scene->elementTransform->exitObjectMode();
  scene->elementTransform->enterTransformedMode();
  scene->elementTransform->setTranslate();
  scene->removeObject(scene->elementTransform);
  action = Action::Wave;
  setGhosted(false);
}